

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_layout_helper.h
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FieldGroup::FieldGroup
          (FieldGroup *this,float preferred_location,FieldDescriptor *field,uint64_t num_accesses)

{
  uint32_t uVar1;
  allocator<const_google::protobuf::FieldDescriptor_*> local_29;
  uint64_t local_28;
  uint64_t num_accesses_local;
  FieldDescriptor *field_local;
  FieldGroup *pFStack_10;
  float preferred_location_local;
  FieldGroup *this_local;
  
  local_28 = num_accesses;
  num_accesses_local = (uint64_t)field;
  field_local._4_4_ = preferred_location;
  pFStack_10 = this;
  std::allocator<const_google::protobuf::FieldDescriptor_*>::allocator(&local_29);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector(&this->fields_,1,(value_type *)&num_accesses_local,&local_29);
  std::allocator<const_google::protobuf::FieldDescriptor_*>::~allocator(&local_29);
  this->preferred_location_ = field_local._4_4_;
  uVar1 = EstimateAlignmentSize((FieldDescriptor *)num_accesses_local);
  this->estimated_memory_size_ = uVar1;
  return;
}

Assistant:

FieldGroup(float preferred_location, const FieldDescriptor* field,
             uint64_t num_accesses = 0)
      : fields_(1, field),
        preferred_location_(preferred_location),
        estimated_memory_size_(
            static_cast<uint32_t>(EstimateAlignmentSize(field))) {
  }